

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_clear(nk_draw_list *list)

{
  nk_draw_list *list_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x19cc,"void nk_draw_list_clear(struct nk_draw_list *)");
  }
  if (list != (nk_draw_list *)0x0) {
    if (list->buffer != (nk_buffer *)0x0) {
      nk_buffer_clear(list->buffer);
    }
    if (list->vertices != (nk_buffer *)0x0) {
      nk_buffer_clear(list->vertices);
    }
    if (list->elements != (nk_buffer *)0x0) {
      nk_buffer_clear(list->elements);
    }
    list->element_count = 0;
    list->vertex_count = 0;
    list->cmd_offset = 0;
    list->cmd_count = 0;
    list->path_count = 0;
    list->vertices = (nk_buffer *)0x0;
    list->elements = (nk_buffer *)0x0;
    (list->clip_rect).x = -8192.0;
    (list->clip_rect).y = -8192.0;
    (list->clip_rect).w = 16384.0;
    (list->clip_rect).h = 16384.0;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_clear(struct nk_draw_list *list)
{
    NK_ASSERT(list);
    if (!list) return;
    if (list->buffer)
        nk_buffer_clear(list->buffer);
    if (list->vertices)
        nk_buffer_clear(list->vertices);
    if (list->elements)
        nk_buffer_clear(list->elements);

    list->element_count = 0;
    list->vertex_count = 0;
    list->cmd_offset = 0;
    list->cmd_count = 0;
    list->path_count = 0;
    list->vertices = 0;
    list->elements = 0;
    list->clip_rect = nk_null_rect;
}